

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_496d49::LoopReportController::collective_flush
          (LoopReportController *this,OutputStream *stream,Comm *comm)

{
  Options *this_00;
  bool bVar1;
  int iVar2;
  StreamType SVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  pointer val;
  uint __val;
  CaliperMetadataDB db;
  string query_3;
  Aggregator summary_cross_agg;
  CalQLParser parser;
  Aggregator cross_agg;
  Comm local_668;
  LoopReportController *local_660;
  pointer local_658;
  pointer local_650;
  Aggregator summary_local_agg;
  Aggregator local_agg;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  SnapshotProcessFn local_608;
  SnapshotProcessFn local_5e8;
  string name;
  string query;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  Caliper c;
  string query_1;
  QuerySpec summary_query_spec;
  
  cali::Caliper::Caliper(&c);
  cali::CaliperMetadataDB::CaliperMetadataDB(&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query_1,
             " let iter_per_sec=ratio(loop.iterations,time.duration.ns,1e-9) select loop,count(),sum(loop.iterations),scale(time.duration.ns,1e-9),min(iter_per_sec),max(iter_per_sec),avg(iter_per_sec) group by loop where loop"
             ,(allocator<char> *)&summary_query_spec);
  this_00 = &this->m_opts;
  cali::ConfigManager::Options::build_query(&query,this_00,"local",&query_1);
  std::__cxx11::string::~string((string *)&query_1);
  cali::CalQLParser::CalQLParser((CalQLParser *)&summary_query_spec,query._M_dataplus._M_p);
  cali::CalQLParser::spec((QuerySpec *)&query_1,(CalQLParser *)&summary_query_spec);
  local_aggregate((LoopReportController *)&summary_local_agg,(Caliper *)this,(CaliperMetadataDB *)&c
                  ,(QuerySpec *)&db);
  cali::QuerySpec::~QuerySpec((QuerySpec *)&query_1);
  cali::CalQLParser::~CalQLParser((CalQLParser *)&summary_query_spec);
  std::__cxx11::string::~string((string *)&query);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query,
             " select loop as Loop,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",min(min#iter_per_sec) as \"Iter/s (min)\",max(max#iter_per_sec) as \"Iter/s (max)\",ratio(sum#loop.iterations,scale#time.duration.ns) as \"Iter/s (avg)\" aggregate max(count) group by loop format table"
             ,(allocator<char> *)&query_3);
  cali::ConfigManager::Options::build_query(&query_1,this_00,"cross",&query);
  std::__cxx11::string::~string((string *)&query);
  cali::CalQLParser::CalQLParser((CalQLParser *)&query,query_1._M_dataplus._M_p);
  cali::CalQLParser::spec(&summary_query_spec,(CalQLParser *)&query);
  cali::CalQLParser::~CalQLParser((CalQLParser *)&query);
  std::__cxx11::string::~string((string *)&query_1);
  cali::Aggregator::Aggregator(&summary_cross_agg,&summary_query_spec);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)&local_5e8,&summary_cross_agg);
  cali::Aggregator::flush(&summary_local_agg,&db.super_CaliperMetadataAccessInterface,&local_5e8);
  std::_Function_base::~_Function_base(&local_5e8.super__Function_base);
  (*comm->_vptr_Comm[5])(comm,&db,&summary_cross_agg);
  iVar2 = (*comm->_vptr_Comm[2])(comm);
  if (iVar2 == 0) {
    SVar3 = cali::OutputStream::type(stream);
    if (SVar3 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_(&query_1,this_00,"output","stdout");
      cali::Caliper::Caliper((Caliper *)&query);
      cali::OutputStream::OutputStream((OutputStream *)&cross_agg);
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&query_3,(Caliper *)&query);
      cali::OutputStream::set_filename
                ((OutputStream *)&cross_agg,query_1._M_dataplus._M_p,
                 (CaliperMetadataAccessInterface *)&query,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)&query_3);
      std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base
                ((_Vector_base<cali::Entry,_std::allocator<cali::Entry>_> *)&query_3);
      std::__cxx11::string::~string((string *)&query_1);
      std::__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2> *)
                 stream,(__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                         *)&cross_agg);
      cali::OutputStream::~OutputStream((OutputStream *)&cross_agg);
    }
    poVar6 = cali::OutputStream::stream(stream);
    bVar1 = cali::ConfigManager::Options::is_set(this_00,"summary");
    if (bVar1) {
      cali::ConfigManager::Options::get_abi_cxx11_(&query,this_00,"summary","");
      std::__cxx11::string::string((string *)&query_1,(string *)&query);
      bVar1 = cali::StringConverter::to_bool((StringConverter *)&query_1,(bool *)0x0);
      std::__cxx11::string::~string((string *)&query_1);
      std::__cxx11::string::~string((string *)&query);
      if (!bVar1) goto LAB_0022023c;
    }
    std::operator<<(poVar6,"\nLoop summary:\n------------\n\n");
    cali::FormatProcessor::FormatProcessor((FormatProcessor *)&query_1,&summary_query_spec,stream);
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FormatProcessor&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&local_608,(FormatProcessor *)&query_1);
    cali::Aggregator::flush(&summary_cross_agg,&db.super_CaliperMetadataAccessInterface,&local_608);
    std::_Function_base::~_Function_base(&local_608.super__Function_base);
    cali::FormatProcessor::flush
              ((FormatProcessor *)&query_1,&db.super_CaliperMetadataAccessInterface);
    cali::FormatProcessor::~FormatProcessor((FormatProcessor *)&query_1);
  }
LAB_0022023c:
  bVar1 = cali::ConfigManager::Options::is_set(this_00,"timeseries");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_(&query,this_00,"timeseries","");
    std::__cxx11::string::string((string *)&query_1,(string *)&query);
    bVar1 = cali::StringConverter::to_bool((StringConverter *)&query_1,(bool *)0x0);
    std::__cxx11::string::~string((string *)&query_1);
    std::__cxx11::string::~string((string *)&query);
    if (!bVar1) goto LAB_00220815;
  }
  local_410._M_unused._M_object = &infovec;
  infovec.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  infovec.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  infovec.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
              ::_M_manager;
  cali::Aggregator::flush
            (&summary_cross_agg,&db.super_CaliperMetadataAccessInterface,
             (SnapshotProcessFn *)&local_410);
  std::_Function_base::~_Function_base((_Function_base *)&local_410);
  local_650 = (pointer)infovec.
                       super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if (infovec.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      infovec.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::ofstream::ofstream(&query_1);
    poVar6 = cali::Log::stream((Log *)&query_1);
    cali::ChannelController::name_abi_cxx11_(&query,(ChannelController *)this);
    poVar6 = std::operator<<(poVar6,(string *)&query);
    poVar6 = std::operator<<(poVar6,": No instrumented loops found");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&query);
    std::ofstream::~ofstream(&query_1);
  }
  else {
    local_658 = (pointer)&PTR__Comm_00290a18;
    local_660 = this;
    for (val = (pointer)infovec.
                        super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start; val != local_650;
        val = (pointer)&val->value) {
      iVar2 = *(int *)((long)&(val->attr_name).field_2 + 8);
      if (0 < iVar2) {
        local_668._vptr_Comm = (_func_int **)local_658;
        uVar4 = cali::internal::CustomOutputController::Comm::bcast_int(&local_668,iVar2);
        iVar2 = cali::internal::CustomOutputController::Comm::bcast_int
                          (&local_668,*(int *)((long)&(val->attr_name).field_2 + 0xc));
        cali::internal::CustomOutputController::Comm::bcast_str(&name,&local_668,(string *)val);
        if (0 < (int)uVar4) {
          bVar1 = cali::ConfigManager::Options::is_set(this_00,"timeseries.maxrows");
          uVar5 = 0x14;
          if (bVar1) {
            cali::ConfigManager::Options::get_abi_cxx11_(&query,this_00,"timeseries.maxrows","");
            std::__cxx11::string::string((string *)&query_1,(string *)&query);
            uVar5 = cali::StringConverter::to_int((StringConverter *)&query_1,(bool *)0x0);
            std::__cxx11::string::~string((string *)&query_1);
            std::__cxx11::string::~string((string *)&query);
            if (0 < (int)uVar5) goto LAB_00220424;
LAB_0022043f:
            __val = 1;
          }
          else {
LAB_00220424:
            if (iVar2 <= (int)uVar5) goto LAB_0022043f;
            __val = uVar4 / uVar5;
            if (uVar4 < uVar5) {
              __val = 1;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&query,
                     " select Block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by Block"
                     ,(allocator<char> *)&query_1);
          psVar7 = (string *)std::__cxx11::string::append((char *)&query);
          std::__cxx11::to_string(&query_1,__val);
          pcVar8 = (char *)std::__cxx11::string::append(psVar7);
          std::__cxx11::string::append(pcVar8);
          std::__cxx11::string::~string((string *)&query_1);
          psVar7 = (string *)std::__cxx11::string::append((char *)&query);
          pcVar8 = (char *)std::__cxx11::string::append(psVar7);
          std::__cxx11::string::append(pcVar8);
          cali::ConfigManager::Options::build_query(&query_1,this_00,"local",&query);
          std::__cxx11::string::operator=((string *)&query,(string *)&query_1);
          std::__cxx11::string::~string((string *)&query_1);
          cali::CalQLParser::CalQLParser((CalQLParser *)&query_3,query._M_dataplus._M_p);
          cali::CalQLParser::spec((QuerySpec *)&query_1,(CalQLParser *)&query_3);
          local_aggregate((LoopReportController *)&local_agg,(Caliper *)local_660,
                          (CaliperMetadataDB *)&c,(QuerySpec *)&db);
          cali::QuerySpec::~QuerySpec((QuerySpec *)&query_1);
          cali::CalQLParser::~CalQLParser((CalQLParser *)&query_3);
          std::__cxx11::string::~string((string *)&query);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&query_1,
                     " select Block,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" group by Block format table order by Block "
                     ,(allocator<char> *)&cross_agg);
          cali::ConfigManager::Options::build_query(&query_3,this_00,"cross",&query_1);
          std::__cxx11::string::~string((string *)&query_1);
          cali::CalQLParser::CalQLParser(&parser,query_3._M_dataplus._M_p);
          bVar1 = cali::CalQLParser::error(&parser);
          if (bVar1) {
            std::ofstream::ofstream((Log *)&query_1);
            poVar6 = cali::Log::stream((Log *)&query_1);
            cali::CalQLParser::error_msg_abi_cxx11_((string *)&cross_agg,&parser);
            poVar6 = std::operator<<(poVar6,(string *)&cross_agg);
            poVar6 = std::operator<<(poVar6," ");
            poVar6 = std::operator<<(poVar6,(string *)&query_3);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&cross_agg);
            std::ofstream::~ofstream((Log *)&query_1);
          }
          cali::CalQLParser::CalQLParser((CalQLParser *)&query_1,query_3._M_dataplus._M_p);
          cali::CalQLParser::spec((QuerySpec *)&query,(CalQLParser *)&query_1);
          cali::CalQLParser::~CalQLParser((CalQLParser *)&query_1);
          cali::CalQLParser::~CalQLParser(&parser);
          std::__cxx11::string::~string((string *)&query_3);
          cali::Aggregator::Aggregator(&cross_agg,(QuerySpec *)&query);
          std::
          function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
          ::function<cali::Aggregator&,void>
                    ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                      *)&query_1,&cross_agg);
          cali::Aggregator::flush
                    (&local_agg,&db.super_CaliperMetadataAccessInterface,
                     (SnapshotProcessFn *)&query_1);
          std::_Function_base::~_Function_base((_Function_base *)&query_1);
          cali::internal::CustomOutputController::Comm::cross_aggregate(&local_668,&db,&cross_agg);
          iVar2 = cali::internal::CustomOutputController::Comm::rank(&local_668);
          if (iVar2 == 0) {
            poVar6 = cali::OutputStream::stream(stream);
            poVar6 = std::operator<<(poVar6,"\nIteration summary (");
            poVar6 = std::operator<<(poVar6,(string *)val);
            std::operator<<(poVar6,"):\n-----------------\n\n");
            cali::FormatProcessor::FormatProcessor
                      ((FormatProcessor *)&parser,(QuerySpec *)&query,stream);
            std::
            function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
            ::function<cali::FormatProcessor&,void>
                      ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                        *)&query_3,(FormatProcessor *)&parser);
            cali::Aggregator::flush
                      (&cross_agg,&db.super_CaliperMetadataAccessInterface,
                       (SnapshotProcessFn *)&query_3);
            std::_Function_base::~_Function_base((_Function_base *)&query_3);
            cali::FormatProcessor::flush
                      ((FormatProcessor *)&parser,&db.super_CaliperMetadataAccessInterface);
            cali::FormatProcessor::~FormatProcessor((FormatProcessor *)&parser);
          }
          cali::Aggregator::~Aggregator(&cross_agg);
          cali::QuerySpec::~QuerySpec((QuerySpec *)&query);
          cali::Aggregator::~Aggregator(&local_agg);
        }
        std::__cxx11::string::~string((string *)&name);
        cali::internal::CustomOutputController::Comm::~Comm(&local_668);
      }
    }
  }
  std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
  ~vector(&infovec);
LAB_00220815:
  cali::Aggregator::~Aggregator(&summary_cross_agg);
  cali::QuerySpec::~QuerySpec(&summary_query_spec);
  cali::Aggregator::~Aggregator(&summary_local_agg);
  cali::CaliperMetadataDB::~CaliperMetadataDB(&db);
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        Caliper           c;
        CaliperMetadataDB db;

        Aggregator summary_local_agg  = summary_local_aggregation(c, db);
        QuerySpec  summary_query_spec = summary_query();
        Aggregator summary_cross_agg(summary_query_spec);

        summary_local_agg.flush(db, summary_cross_agg);

        comm.cross_aggregate(db, summary_cross_agg);

        if (comm.rank() == 0) {
            if (stream.type() == OutputStream::None)
                stream = create_stream();

            std::ostream* os = stream.stream();

            bool print_summary = true;
            if (m_opts.is_set("summary"))
                print_summary = StringConverter(m_opts.get("summary")).to_bool();

            if (print_summary) {
                *os << "\nLoop summary:\n------------\n\n";

                FormatProcessor formatter(summary_query_spec, stream);
                summary_cross_agg.flush(db, formatter);
                formatter.flush(db);
            }
        }

        bool print_timeseries = true;
        if (m_opts.is_set("timeseries"))
            print_timeseries = StringConverter(m_opts.get("timeseries")).to_bool();

        if (print_timeseries) {
            std::vector<LoopInfo> infovec;

            summary_cross_agg.flush(db, [&infovec](CaliperMetadataAccessInterface& db, const EntryList& rec) {
                infovec.push_back(get_loop_info(db, rec));
            });

            if (!infovec.empty()) {
                for (const LoopInfo& loopinfo : infovec)
                    if (loopinfo.iterations > 0)
                        process_timeseries(c, db, stream, loopinfo, comm);
            } else {
                Log(1).stream() << name() << ": No instrumented loops found" << std::endl;
            }
        }
    }